

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

ImageT<unsigned_char,_1U> * __thiscall
ImageT<unsigned_char,_1U>::transformColorSpace
          (ImageT<unsigned_char,_1U> *this,TransferFunction *decode,TransferFunction *encode,
          ColorPrimaryTransform *transformPrimaries)

{
  Color *pCVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  float (*pafVar6) [3];
  ulong uVar7;
  undefined4 extraout_XMM0_Da;
  float fVar8;
  float extraout_XMM0_Da_00;
  float fVar9;
  float intensity [3];
  undefined8 local_60;
  undefined4 local_58;
  ImageT<unsigned_char,_1U> *local_50;
  ulong local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  uVar2 = (this->super_Image).height * (this->super_Image).width;
  local_50 = this;
  if (uVar2 != 0) {
    local_48 = (ulong)uVar2;
    uVar7 = 0;
    do {
      pCVar1 = local_50->pixels;
      uVar2 = (*(local_50->super_Image)._vptr_Image[5])();
      uVar3 = 3;
      if (uVar2 < 3) {
        uVar3 = (ulong)uVar2;
      }
      if (uVar2 == 0) {
        if (transformPrimaries != (ColorPrimaryTransform *)0x0) goto LAB_001977b3;
      }
      else {
        uVar5 = 0;
        do {
          (*decode->_vptr_TransferFunction[1])
                    ((ulong)(uint)((float)pCVar1[uVar7].field_0.comps[0] * 0.003921569),decode);
          *(undefined4 *)((long)&local_60 + uVar5 * 4) = extraout_XMM0_Da;
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
        if (transformPrimaries != (ColorPrimaryTransform *)0x0) {
          local_40 = local_60;
          local_38 = local_58;
          if (uVar2 != 0) {
            uVar5 = 0;
            pafVar6 = (float (*) [3])transformPrimaries;
            do {
              fVar8 = 0.0;
              uVar4 = 0;
              do {
                fVar8 = fVar8 + (*(float (*) [3])*pafVar6)[uVar4] *
                                *(float *)((long)&local_40 + uVar4 * 4);
                uVar4 = uVar4 + 1;
              } while (uVar3 != uVar4);
              *(float *)((long)&local_60 + uVar5 * 4) = fVar8;
              uVar5 = uVar5 + 1;
              pafVar6 = pafVar6 + 1;
            } while (uVar5 != uVar3);
          }
        }
LAB_001977b3:
        if (uVar2 != 0) {
          uVar5 = 0;
          do {
            (**encode->_vptr_TransferFunction)((ulong)*(uint *)((long)&local_60 + uVar5 * 4),encode)
            ;
            fVar9 = roundf(extraout_XMM0_Da_00 * 255.0);
            fVar8 = 255.0;
            if (fVar9 <= 255.0) {
              fVar8 = fVar9;
            }
            pCVar1[uVar7].field_0 = SUB41((int)(float)(~-(uint)(fVar9 < 0.0) & (uint)fVar8),0);
            uVar5 = uVar5 + 1;
          } while (uVar3 != uVar5);
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != local_48);
  }
  return local_50;
}

Assistant:

virtual ImageT& transformColorSpace(const TransferFunction& decode, const TransferFunction& encode,
                                        const ColorPrimaryTransform* transformPrimaries) override {
        uint32_t pixelCount = getPixelCount();
        for (uint32_t i = 0; i < pixelCount; ++i) {
            Color& c = pixels[i];
            // Don't transform the alpha component.
            uint32_t components = cclamp(getComponentCount(), 0u, 3u);
            float intensity[3];
            float brightness[3];

            // Decode source transfer function
            for (uint32_t comp = 0; comp < components; comp++) {
                brightness[comp] = (float)(c[comp]) * Color::rcpOne();
                intensity[comp] = decode.decode(brightness[comp]);
            }

            // If needed, transform primaries
            if (transformPrimaries != nullptr) {
                float origIntensity[3] = { intensity[0], intensity[1], intensity[2] };
                for (uint32_t j = 0; j < components; ++j) {
                    intensity[j] = 0.f;
                    for (uint32_t k = 0; k < components; ++k)
                        intensity[j] += transformPrimaries->matrix[j][k] * origIntensity[k];
                }
            }

            // Encode destination transfer function
            for (uint32_t comp = 0; comp < components; comp++) {
                brightness[comp] = encode.encode(intensity[comp]);
                // clamp(value, color::min, color::max) is required as static_cast has platform-specific behaviors
                // and on certain platforms can over or underflow
                c.set(comp, cclamp(
                        roundf(brightness[comp] * static_cast<float>(Color::one())),
                        static_cast<float>(Color::min()),
                        static_cast<float>(Color::max())));
            }
        }
        return *this;
    }